

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O3

bool libwebm::vttdemux::OpenFiles(metadata_map_t *metadata_map,char *filename)

{
  _Rb_tree_node_base *p_Var1;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  FILE *pFVar4;
  bool bVar5;
  _Self __tmp;
  _Self __tmp_1;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_header *p_Var7;
  Type type_1;
  string name;
  map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
  exists;
  Type type;
  key_type local_bc;
  char *local_b8 [2];
  char local_a8 [16];
  char *local_98;
  char *local_90;
  _Rb_tree<libwebm::vttdemux::MetadataInfo::Type,_std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>,_std::_Select1st<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
  local_88;
  key_type local_58 [10];
  
  if (metadata_map != (metadata_map_t *)0x0) {
    if (filename == (char *)0x0) {
      return false;
    }
    if ((metadata_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      return false;
    }
    local_90 = strrchr(filename,0x2e);
    if (local_90 != (char *)0x0) {
      local_88._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_88._M_impl.super__Rb_tree_header._M_header;
      local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var6 = (metadata_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = &(metadata_map->_M_t)._M_impl.super__Rb_tree_header;
      bVar5 = true;
      local_88._M_impl.super__Rb_tree_header._M_header._M_right =
           local_88._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var6 != p_Var7) {
        p_Var3 = p_Var6;
        local_98 = filename;
        do {
          p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
          local_58[0] = *(key_type *)&p_Var3[1]._M_parent;
          pmVar2 = std::
                   map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                   ::operator[]((map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                                 *)&local_88,local_58);
          *pmVar2 = *pmVar2 + 1;
          p_Var3 = p_Var1;
        } while ((_Rb_tree_header *)p_Var1 != p_Var7);
        if ((_Rb_tree_header *)p_Var6 != p_Var7) {
          do {
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            local_bc = *(key_type *)&p_Var6[1]._M_parent;
            local_b8[0] = local_a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,local_98,local_90);
            if (kChapters < local_bc) {
LAB_0010c8e7:
              if (local_b8[0] != local_a8) {
                operator_delete(local_b8[0]);
              }
              bVar5 = false;
              goto LAB_0010c8f8;
            }
            std::__cxx11::string::append((char *)local_b8);
            pmVar2 = std::
                     map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                     ::operator[]((map<libwebm::vttdemux::MetadataInfo::Type,_int,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
                                   *)&local_88,&local_bc);
            if (1 < *pmVar2) {
              snprintf((char *)local_58,0x21,"%ld",*(undefined8 *)(p_Var6 + 1));
              std::__cxx11::string::append((char *)local_b8);
            }
            std::__cxx11::string::append((char *)local_b8);
            pFVar4 = fopen(local_b8[0],"wb");
            p_Var6[1]._M_left = (_Base_ptr)pFVar4;
            if (pFVar4 == (FILE *)0x0) {
              printf("unable to open output file %s\n");
              goto LAB_0010c8e7;
            }
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0]);
            }
            p_Var6 = p_Var3;
          } while ((_Rb_tree_header *)p_Var3 != p_Var7);
        }
        bVar5 = true;
      }
LAB_0010c8f8:
      std::
      _Rb_tree<libwebm::vttdemux::MetadataInfo::Type,_std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>,_std::_Select1st<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>,_std::less<libwebm::vttdemux::MetadataInfo::Type>,_std::allocator<std::pair<const_libwebm::vttdemux::MetadataInfo::Type,_int>_>_>
      ::~_Rb_tree(&local_88);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool vttdemux::OpenFiles(metadata_map_t* metadata_map, const char* filename) {
  if (metadata_map == NULL || metadata_map->empty())
    return false;

  if (filename == NULL)
    return false;

  // Find the position of the filename extension.  We synthesize the
  // output filename from the directory path and basename of the input
  // filename.

  const char* const ext = strrchr(filename, '.');

  if (ext == NULL)  // TODO(matthewjheaney): liberalize?
    return false;

  // Remember whether a track of this type has already been seen (the
  // map key) by keeping a count (the map item).  We quality the
  // output filename with the track number if there is more than one
  // track having a given type.

  std::map<MetadataInfo::Type, int> exists;

  typedef metadata_map_t::iterator iter_t;

  metadata_map_t& m = *metadata_map;
  const iter_t ii = m.begin();
  const iter_t j = m.end();

  // Make a first pass over the cache to determine whether there is
  // more than one track corresponding to a given metadata type.

  iter_t i = ii;
  while (i != j) {
    const metadata_map_t::value_type& v = *i++;
    const MetadataInfo& info = v.second;
    const MetadataInfo::Type type = info.type;
    ++exists[type];
  }

  // Make a second pass over the cache, synthesizing the filename of
  // each output file (from the input file basename, the input track
  // metadata type, and its track number if necessary), and then
  // opening a WebVTT output file having that filename.

  i = ii;
  while (i != j) {
    metadata_map_t::value_type& v = *i++;
    MetadataInfo& info = v.second;
    const MetadataInfo::Type type = info.type;

    // Start with the basename of the input file.

    string name(filename, ext);

    // Next append the metadata kind.

    switch (type) {
      case MetadataInfo::kSubtitles:
        name += "_SUBTITLES";
        break;

      case MetadataInfo::kCaptions:
        name += "_CAPTIONS";
        break;

      case MetadataInfo::kDescriptions:
        name += "_DESCRIPTIONS";
        break;

      case MetadataInfo::kMetadata:
        name += "_METADATA";
        break;

      case MetadataInfo::kChapters:
        name += "_CHAPTERS";
        break;

      default:
        return false;
    }

    // If there is more than one metadata track having a given type
    // (the WebVTT-in-WebM spec doesn't preclude this), then qualify
    // the output filename with the input track number.

    if (exists[type] > 1) {
      enum { kLen = 33 };
      char str[kLen];  // max 126 tracks, so only 4 chars really needed
#ifndef _MSC_VER
      snprintf(str, kLen, "%ld", v.first);  // track number
#else
      _snprintf_s(str, sizeof(str), kLen, "%ld", v.first);  // track number
#endif
      name += str;
    }

    // Finally append the output filename extension.

    name += ".vtt";

    // We have synthesized the full output filename, so attempt to
    // open the WebVTT output file.

    info.file = fopen(name.c_str(), "wb");
    const bool success = (info.file != NULL);

    if (!success) {
      printf("unable to open output file %s\n", name.c_str());
      return false;
    }
  }

  return true;
}